

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ** __thiscall ImGuiStorage::GetVoidPtrRef(ImGuiStorage *this,ImGuiID key,void *default_val)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ImGuiStoragePair *pIVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ImGuiStoragePair *pIVar11;
  int iVar12;
  
  pIVar5 = (this->Data).Data;
  iVar2 = (this->Data).Size;
  pIVar11 = pIVar5;
  uVar7 = (long)iVar2;
  while (uVar4 = uVar7, uVar4 != 0) {
    uVar7 = uVar4 >> 1;
    if (pIVar11[uVar7].key < key) {
      pIVar11 = pIVar11 + uVar7 + 1;
      uVar7 = ~uVar7 + uVar4;
    }
  }
  if ((pIVar11 == pIVar5 + iVar2) || (pIVar11->key != key)) {
    lVar10 = (long)pIVar11 - (long)pIVar5;
    iVar3 = (this->Data).Capacity;
    if (iVar2 == iVar3) {
      if (iVar3 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar3 / 2 + iVar3;
      }
      iVar12 = iVar2 + 1;
      if (iVar2 + 1 < iVar6) {
        iVar12 = iVar6;
      }
      if (iVar3 < iVar12) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar5 = (ImGuiStoragePair *)
                 (*GImAllocatorAllocFunc)((long)iVar12 << 4,GImAllocatorUserData);
        pIVar11 = (this->Data).Data;
        if (pIVar11 != (ImGuiStoragePair *)0x0) {
          memcpy(pIVar5,pIVar11,(long)(this->Data).Size << 4);
          pIVar11 = (this->Data).Data;
          if ((pIVar11 != (ImGuiStoragePair *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar11,GImAllocatorUserData);
        }
        (this->Data).Data = pIVar5;
        (this->Data).Capacity = iVar12;
      }
    }
    lVar8 = (long)(this->Data).Size;
    lVar9 = lVar8 - (lVar10 >> 4);
    if (lVar9 != 0 && lVar10 >> 4 <= lVar8) {
      pIVar11 = (this->Data).Data;
      memmove((void *)((long)pIVar11 + lVar10 + 0x10),(void *)((long)pIVar11 + lVar10),lVar9 * 0x10)
      ;
    }
    pIVar11 = (this->Data).Data;
    *(ImGuiID *)((long)pIVar11 + lVar10) = key;
    *(void **)((long)pIVar11 + lVar10 + 8) = default_val;
    (this->Data).Size = (this->Data).Size + 1;
    pIVar11 = (ImGuiStoragePair *)(lVar10 + (long)(this->Data).Data);
  }
  return (void **)&pIVar11->field_1;
}

Assistant:

void** ImGuiStorage::GetVoidPtrRef(ImGuiID key, void* default_val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, ImGuiStoragePair(key, default_val));
    return &it->val_p;
}